

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSymm.c
# Opt level: O3

void Ntk_SymTryRandomFlips(word *pFun,word *pNpn,int nVars)

{
  ulong uVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  ulong *__dest;
  ulong uVar5;
  byte bVar6;
  byte bVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  ulong *puVar13;
  ulong *puVar14;
  
  uVar3 = 1 << ((char)nVars - 6U & 0x1f);
  if (nVars < 7) {
    uVar3 = 1;
  }
  uVar9 = (ulong)uVar3;
  __dest = (ulong *)calloc((long)(int)uVar3,8);
  if (0 < (int)uVar3) {
    memcpy(__dest,pFun,uVar9 * 8);
  }
  lVar10 = 0;
  do {
    lVar2 = (long)(int)(&DAT_009917f0)[lVar10] % (long)(nVars + -1);
    bVar6 = (byte)lVar2;
    iVar8 = (int)lVar2;
    if (uVar3 == 1) {
      bVar6 = (byte)(1 << (bVar6 & 0x1f));
      *__dest = (s_Truths6[iVar8] & *__dest) >> (bVar6 & 0x3f) |
                *__dest << (bVar6 & 0x3f) & s_Truths6[iVar8];
    }
    else if (iVar8 < 6) {
      if (0 < (int)uVar3) {
        uVar5 = s_Truths6[iVar8];
        uVar12 = 0;
        do {
          bVar7 = (byte)(1 << (bVar6 & 0x1f));
          __dest[uVar12] =
               (__dest[uVar12] & uVar5) >> (bVar7 & 0x3f) | __dest[uVar12] << (bVar7 & 0x3f) & uVar5
          ;
          uVar12 = uVar12 + 1;
        } while (uVar9 != uVar12);
      }
    }
    else if (0 < (int)uVar3) {
      bVar6 = (byte)(iVar8 + -6);
      uVar4 = 1 << (bVar6 & 0x1f);
      iVar11 = 2 << (bVar6 & 0x1f);
      uVar5 = 1;
      if (1 < (int)uVar4) {
        uVar5 = (ulong)uVar4;
      }
      puVar13 = __dest + (int)uVar4;
      puVar14 = __dest;
      do {
        if (iVar8 + -6 != 0x1f) {
          uVar12 = 0;
          do {
            uVar1 = puVar14[uVar12];
            puVar14[uVar12] = puVar13[uVar12];
            puVar13[uVar12] = uVar1;
            uVar12 = uVar12 + 1;
          } while (uVar5 != uVar12);
        }
        puVar14 = puVar14 + iVar11;
        puVar13 = puVar13 + iVar11;
      } while (puVar14 < __dest + (int)uVar3);
    }
    lVar10 = lVar10 + 1;
  } while (lVar10 != 0x10);
  do {
    if ((int)uVar9 < 1) {
      if (__dest == (ulong *)0x0) {
        return;
      }
      goto LAB_003193c8;
    }
    lVar10 = uVar9 - 1;
    lVar2 = uVar9 - 1;
    uVar9 = uVar9 - 1;
  } while (pNpn[lVar2] == __dest[lVar10]);
  if (__dest[lVar10] <= pNpn[lVar2]) {
    __assert_fail("Abc_TtCompareRev(pNpn, pFunT, nWords) != 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcSymm.c"
                  ,0x105,"void Ntk_SymTryRandomFlips(word *, word *, int)");
  }
LAB_003193c8:
  free(__dest);
  return;
}

Assistant:

void Ntk_SymTryRandomFlips( word * pFun, word * pNpn, int nVars )
{
    int Rand[16] = { 17290, 20203, 19027, 12035, 14687, 10920, 10413, 261, 2072, 16899, 4480, 6192, 3978, 8343, 745, 1370 };
    int i, nWords = Abc_TtWordNum(nVars);
    word * pFunT = ABC_CALLOC( word, nWords );
    Abc_TtCopy( pFunT, pFun, nWords, 0 );
    for ( i = 0; i < 16; i++ )
        Abc_TtFlip( pFunT, nWords, Rand[i] % (nVars-1) );
    assert( Abc_TtCompareRev(pNpn, pFunT, nWords) != 1 );
    ABC_FREE( pFunT );
}